

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

bool __thiscall miniscript::Node<CPubKey>::IsSane(Node<CPubKey> *this)

{
  long lVar1;
  bool bVar2;
  Node<CPubKey> *in_RDI;
  long in_FS_OFFSET;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValidTopLevel(in_RDI);
  bVar3 = false;
  if (bVar2) {
    bVar2 = IsSaneSubexpression((Node<CPubKey> *)(ulong)in_stack_ffffffffffffffe8);
    bVar3 = false;
    if (bVar2) {
      bVar3 = NeedsSignature(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool IsSane() const { return IsValidTopLevel() && IsSaneSubexpression() && NeedsSignature(); }